

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::error_already_set::error_already_set(error_already_set *this)

{
  PyObject **ppPVar1;
  PyObject **ppPVar2;
  PyObject **ppPVar3;
  string local_30 [32];
  error_already_set *local_10;
  error_already_set *this_local;
  
  local_10 = this;
  detail::error_string_abi_cxx11_();
  std::runtime_error::runtime_error(&this->super_runtime_error,local_30);
  std::__cxx11::string::~string(local_30);
  *(undefined ***)this = &PTR__error_already_set_001b0a78;
  object::object(&this->type);
  object::object(&this->value);
  object::object(&this->trace);
  ppPVar1 = handle::ptr(&(this->type).super_handle);
  ppPVar2 = handle::ptr(&(this->value).super_handle);
  ppPVar3 = handle::ptr(&(this->trace).super_handle);
  PyErr_Fetch(ppPVar1,ppPVar2,ppPVar3);
  return;
}

Assistant:

error_already_set() : std::runtime_error(detail::error_string()) {
        PyErr_Fetch(&type.ptr(), &value.ptr(), &trace.ptr());
    }